

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  long lVar1;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var2;
  long *plVar3;
  ulong uVar4;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var5;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var6;
  long *plVar7;
  value_container_type buffer;
  long *local_40;
  long *local_38;
  long local_30;
  iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  local_28;
  
  __first._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin._M_current;
  __last._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End._M_current;
  _Var6._M_current = __last._M_current;
  _Var2._M_current = __first._M_current;
  if (__first._M_current != __last._M_current) {
    do {
      plVar7 = _Var2._M_current + 1;
      _Var6._M_current = __last._M_current;
      if (plVar7 == __last._M_current) break;
      lVar1 = *_Var2._M_current;
      _Var6._M_current = _Var2._M_current;
      _Var2._M_current = plVar7;
    } while (lVar1 < *plVar7);
  }
  if (_Var6._M_current == __last._M_current) {
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
              (this,range);
    return;
  }
  std::vector<long,std::allocator<long>>::
  vector<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,void>
            ((vector<long,std::allocator<long>> *)&local_40,__first,__last,
             (allocator_type *)&local_28);
  plVar3 = local_38;
  plVar7 = local_40;
  if (local_40 != local_38) {
    uVar4 = (long)local_38 - (long)local_40 >> 3;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (local_40,local_38,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (plVar7,plVar3);
  }
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::less<void>>>>
                    (local_40,local_38);
  if ((_Var5._M_current != local_38) && (local_38 != _Var5._M_current)) {
    local_38 = _Var5._M_current;
  }
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_40;
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_38;
  initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
            (this,&local_28);
  if (local_40 != (long *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }